

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

string * __thiscall TCLAP::Arg::getDescription_abi_cxx11_(string *__return_storage_ptr__,Arg *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  Arg *local_18;
  Arg *this_local;
  string *desc;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Arg *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_description);
  if ((this->_required & 1U) != 0) {
    std::operator+(&local_60," (",&this->_requireLabel);
    std::operator+(&local_40,&local_60,")");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Arg::getDescription() const
{
	std::string desc = _description;

	if(_required) {
		desc += " (" + _requireLabel + ")";
	}

	return desc;
}